

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O0

int Dsd_TreeCollectDecomposableVars(Dsd_Manager_t *pDsdMan,int *pVars)

{
  int local_1c;
  int *piStack_18;
  int nVars;
  int *pVars_local;
  Dsd_Manager_t *pDsdMan_local;
  
  local_1c = 0;
  piStack_18 = pVars;
  pVars_local = (int *)pDsdMan;
  Dsd_TreeCollectDecomposableVars_rec
            (pDsdMan->dd,(Dsd_Node_t *)((ulong)*pDsdMan->pRoots & 0xfffffffffffffffe),pVars,
             &local_1c);
  return local_1c;
}

Assistant:

int Dsd_TreeCollectDecomposableVars( Dsd_Manager_t * pDsdMan, int * pVars )
{
    int nVars;

    // set the vars collected to 0
    nVars = 0;
    Dsd_TreeCollectDecomposableVars_rec( pDsdMan->dd, Dsd_Regular(pDsdMan->pRoots[0]), pVars, &nVars );
    // return the number of collected vars
    return nVars;
}